

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O1

void __thiscall
aeron::util::MemoryMappedFile::MemoryMappedFile
          (MemoryMappedFile *this,FileHandle fd,off_t offset,size_t length)

{
  uint8_t *puVar1;
  MemoryMappedFile *pMVar2;
  MemoryMappedFile *this_00;
  stat statInfo;
  stat64 local_b0;
  
  pMVar2 = (MemoryMappedFile *)(ulong)(uint)fd.handle;
  this->m_memory = (uint8_t *)0x0;
  this->m_memorySize = 0;
  this_00 = this;
  if (length == 0 && offset == 0) {
    fstat64(fd.handle,&local_b0);
    length = local_b0.st_size;
    this_00 = pMVar2;
  }
  this->m_memorySize = length;
  puVar1 = doMapping(this_00,length,fd,offset);
  this->m_memory = puVar1;
  return;
}

Assistant:

MemoryMappedFile::MemoryMappedFile(FileHandle fd, off_t offset, size_t length)
{
    if (0 == length && 0 == offset)
    {
        struct stat statInfo;
        ::fstat(fd.handle, &statInfo);
        length = statInfo.st_size;
    }

    m_memorySize = length;
    m_memory = doMapping(m_memorySize, fd, offset);
}